

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bytedata.cpp
# Opt level: O0

void __thiscall ByteData_SplitData_Test::~ByteData_SplitData_Test(ByteData_SplitData_Test *this)

{
  ByteData_SplitData_Test *this_local;
  
  testing::Test::~Test(&this->super_Test);
  return;
}

Assistant:

TEST(ByteData, SplitData) {
  ByteData data("00112233444444444444444444444444444444444444444455555555");
  auto sub_data = data.SplitData(4);
  EXPECT_EQ("00112233", sub_data.GetHex());
  auto list = data.SplitData(std::vector<uint32_t>{4, 20});
  EXPECT_EQ(2, list.size());
  if (list.size() == 2) {
    EXPECT_EQ("00112233", list[0].GetHex());
    EXPECT_EQ("4444444444444444444444444444444444444444", list[1].GetHex());
    EXPECT_TRUE(sub_data == list[0]);
    EXPECT_FALSE(sub_data == list[1]);
  }
}